

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O1

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::~ProtoSignal
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this)

{
  SignalLink *this_00;
  char *in_RSI;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    return;
  }
  while( true ) {
    this_00 = this->callback_ring_;
    if (this_00->next == this_00) break;
    SignalLink::unlink(this_00->next,in_RSI);
  }
  SignalLink::decref(this_00);
  SignalLink::decref(this->callback_ring_);
  return;
}

Assistant:

~ProtoSignal() {
    if (callback_ring_) {
      while (callback_ring_->next != callback_ring_)
        callback_ring_->next->unlink();
      assert(callback_ring_->ref_count >= 2);
      callback_ring_->decref();
      callback_ring_->decref();
    }
  }